

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safeint.h
# Opt level: O2

SafeInt<int> mp::operator+(SafeInt<int> a,SafeInt<int> b)

{
  undefined8 *puVar1;
  
  if (a.value_ < 0) {
    if (b.value_ < -0x80000000 - a.value_) goto LAB_00139719;
  }
  else if ((int)(a.value_ ^ 0x7fffffffU) < b.value_) {
LAB_00139719:
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = &PTR__exception_00192230;
    __cxa_throw(puVar1,&OverflowError::typeinfo,std::exception::~exception);
  }
  return (SafeInt<int>)(b.value_ + a.value_);
}

Assistant:

inline SafeInt<T> operator+(SafeInt<T> a, SafeInt<T> b) {
  T a_value = val(a), b_value = val(b);
  if (!fmt::internal::is_negative(a_value)) {
    if (b_value > std::numeric_limits<T>::max() - a_value)
      throw OverflowError();
  } else if (b_value < std::numeric_limits<T>::min() - a_value)
    throw OverflowError();
  return a_value + b_value;
}